

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServer::RegisterProtocol(cmServer *this,cmServerProtocol *protocol)

{
  bool bVar1;
  uint uVar2;
  __normal_iterator<cmServerProtocol_**,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
  local_48;
  cmServerProtocol **local_40;
  cmServerProtocol **local_38;
  __normal_iterator<cmServerProtocol_**,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
  local_30;
  __normal_iterator<cmServerProtocol_**,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
  local_28;
  __normal_iterator<cmServerProtocol_**,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
  it;
  pair<int,_int> version;
  cmServerProtocol *protocol_local;
  cmServer *this_local;
  
  version = (pair<int,_int>)protocol;
  uVar2 = (*protocol->_vptr_cmServerProtocol[3])();
  if (((uVar2 & 1) == 0) || ((this->SupportExperimental & 1U) != 0)) {
    it._M_current = (cmServerProtocol **)(**(code **)(*(long *)version + 0x10))();
    if ((int)it._M_current < 0) {
      __assert_fail("version.first >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                    ,0x7c,"void cmServer::RegisterProtocol(cmServerProtocol *)");
    }
    if ((long)it._M_current < 0) {
      __assert_fail("version.second >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                    ,0x7d,"void cmServer::RegisterProtocol(cmServerProtocol *)");
    }
    local_30._M_current =
         (cmServerProtocol **)
         std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>::begin
                   (&this->SupportedProtocols);
    local_38 = (cmServerProtocol **)
               std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>::end
                         (&this->SupportedProtocols);
    local_40 = it._M_current;
    local_28 = std::
               find_if<__gnu_cxx::__normal_iterator<cmServerProtocol**,std::vector<cmServerProtocol*,std::allocator<cmServerProtocol*>>>,cmServer::RegisterProtocol(cmServerProtocol*)::__0>
                         (local_30,(__normal_iterator<cmServerProtocol_**,_std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>_>
                                    )local_38,it._M_current);
    local_48._M_current =
         (cmServerProtocol **)
         std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>::end
                   (&this->SupportedProtocols);
    bVar1 = __gnu_cxx::operator==(&local_28,&local_48);
    if (bVar1) {
      std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>::push_back
                (&this->SupportedProtocols,(value_type *)&version);
    }
  }
  else if (version != (pair<int,_int>)0x0) {
    (**(code **)(*(long *)version + 8))();
  }
  return;
}

Assistant:

void cmServer::RegisterProtocol(cmServerProtocol* protocol)
{
  if (protocol->IsExperimental() && !this->SupportExperimental) {
    delete protocol;
    return;
  }
  auto version = protocol->ProtocolVersion();
  assert(version.first >= 0);
  assert(version.second >= 0);
  auto it = std::find_if(this->SupportedProtocols.begin(),
                         this->SupportedProtocols.end(),
                         [version](cmServerProtocol* p) {
                           return p->ProtocolVersion() == version;
                         });
  if (it == this->SupportedProtocols.end()) {
    this->SupportedProtocols.push_back(protocol);
  }
}